

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_database.cpp
# Opt level: O1

bool __thiscall fineftp::UserDatabase::isUsernameAnonymousUser(UserDatabase *this,string *username)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if (username->_M_string_length != 0) {
    iVar1 = ::std::__cxx11::string::compare((char *)username);
    if (iVar1 != 0) {
      iVar1 = ::std::__cxx11::string::compare((char *)username);
      bVar2 = iVar1 == 0;
    }
  }
  return bVar2;
}

Assistant:

bool UserDatabase::isUsernameAnonymousUser(const std::string& username) const
  {
    return (username.empty()
      || username == "ftp"
      || username == "anonymous");
  }